

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

bool __thiscall
cs_impl::any::
holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
::compare(holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
          *this,baseHolder *obj)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
  *in_RSI;
  type_info *in_RDI;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_ffffffffffffffc8;
  bool local_1;
  type_info *this_00;
  
  iVar2 = (*(in_RSI->super_baseHolder)._vptr_baseHolder[2])();
  this_00 = (type_info *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*(long *)in_RDI + 0x10))();
  bVar1 = std::type_info::operator==(this_00,in_RDI);
  if (bVar1) {
    in_RDI = in_RDI + 8;
    data(in_RSI);
    local_1 = compare<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                        ((flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                          *)in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}